

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O0

void utest_gui_component_parse_color_3(int *utest_result,size_t utest_index)

{
  size_t utest_index_local;
  int *utest_result_local;
  
  utest_run_gui_component_parse_color_3(utest_result);
  return;
}

Assistant:

UTEST(gui, component_parse_color_3) {
    std::string line, uniform_line, error;
    GUIComponent component;

    line = "color3";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(0, line, uniform_line, {}, component, error));
    T(component.UniformType == EGUIUniformTypeVec3);
    T(error.empty());

#if 0
    line = "color3()";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(0, line, uniform_line, {}, component, error));

    line = "color3(5.0)";
    uniform_line = "uniform vec3 v0;";
    T(GUIComponentParse(2, line, uniform_line, {}, component, error));
#endif

    line = "color3(0.1, -1, 2.5)";
    for (const auto& datatype : {"float", "vec2"}) {
        uniform_line = "uniform " + std::string(datatype) + " v0;";
        T(!GUIComponentParse(5, line, uniform_line, {}, component, error));
        TSTR(error.c_str(), "GUI component count does not match uniform component count at line 5");
    }
}